

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong extraout_RAX;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uchar *p1;
  uchar *p2;
  uchar pk_expected32 [32];
  secp256k1_ge pk;
  byte local_98 [32];
  secp256k1_ge local_78;
  
  if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_check_cold_3();
  }
  else if (tweaked_pubkey32 == (uchar *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_check_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      iVar3 = secp256k1_pubkey_load(ctx,&local_78,(secp256k1_pubkey *)internal_pubkey);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = secp256k1_ec_pubkey_tweak_add_helper(&local_78,tweak32);
      if (iVar3 == 0) {
        return 0;
      }
      secp256k1_fe_impl_normalize_var(&local_78.x);
      secp256k1_fe_impl_normalize_var(&local_78.y);
      secp256k1_fe_impl_get_b32(local_98,&local_78.x);
      lVar5 = 0;
      uVar4 = extraout_RAX;
      do {
        uVar6 = uVar4 & 0xffffffff;
        bVar1 = local_98[lVar5];
        bVar2 = tweaked_pubkey32[lVar5];
        uVar4 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar4 = uVar6;
        }
        iVar3 = (int)uVar4;
        if (bVar1 != bVar2) goto LAB_00b42a38;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar3 = 0;
LAB_00b42a38:
      if (iVar3 != 0) {
        return 0;
      }
      return (uint)(((uint)local_78.y.n[0] & 1) == tweaked_pk_parity);
    }
    secp256k1_xonly_pubkey_tweak_add_check_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}